

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

int Gia_ManHashXor(Gia_Man_t *p,int iLit0,int iLit1)

{
  uint uVar1;
  uint uVar2;
  
  if ((iLit0 < 0) || (iLit1 < 0)) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10d,"int Abc_LitIsCompl(int)");
  }
  uVar1 = Gia_ManHashAnd(p,iLit0 & 0x7ffffffe,iLit1 | 1);
  uVar2 = Gia_ManHashAnd(p,iLit1 & 0x7ffffffe,iLit0 | 1);
  if ((-1 < (int)uVar1) && (-1 < (int)uVar2)) {
    uVar1 = Gia_ManHashAnd(p,uVar1 ^ 1,uVar2 ^ 1);
    if (-1 < (int)uVar1) {
      return (iLit1 ^ iLit0) & 1U ^ uVar1 ^ 1;
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10f,"int Abc_LitNotCond(int, int)");
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10e,"int Abc_LitNot(int)");
}

Assistant:

int Gia_ManHashXor( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    int fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
    int iTemp0 = Gia_ManHashAnd( p, Abc_LitRegular(iLit0), Abc_LitNot(Abc_LitRegular(iLit1)) );
    int iTemp1 = Gia_ManHashAnd( p, Abc_LitRegular(iLit1), Abc_LitNot(Abc_LitRegular(iLit0)) );
    return Abc_LitNotCond( Gia_ManHashAnd( p, Abc_LitNot(iTemp0), Abc_LitNot(iTemp1) ), !fCompl );
}